

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVHandlePtr.cxx
# Opt level: O1

void __thiscall
cm::uv_handle_deleter<uv_signal_s>::operator()
          (uv_handle_deleter<uv_signal_s> *this,uv_signal_t *handle)

{
  int iVar1;
  
  if (handle != (uv_signal_t *)0x0) {
    uv_signal_stop(handle);
    iVar1 = uv_is_closing((uv_handle_t *)handle);
    if (iVar1 != 0) {
      __assert_fail("!uv_is_closing(handle)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmUVHandlePtr.cxx"
                    ,0x40,"void cm::handle_default_delete(T *) [T = uv_signal_s]");
    }
    iVar1 = uv_is_closing((uv_handle_t *)handle);
    if (iVar1 == 0) {
      uv_close((uv_handle_t *)handle,
               handle_default_delete<uv_signal_s>::anon_class_1_0_00000001::__invoke);
      return;
    }
  }
  return;
}

Assistant:

void operator()(uv_signal_t* handle) const
  {
    if (handle) {
      uv_signal_stop(handle);
      handle_default_delete(handle);
    }
  }